

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.h
# Opt level: O1

void __thiscall
slang::ast::CaseAssertionExpr::visitExprs<LookupIdentifier&>
          (CaseAssertionExpr *this,LookupIdentifier *visitor)

{
  pointer pIVar1;
  size_t sVar2;
  pointer ppEVar3;
  Expression *this_00;
  long lVar4;
  ItemGroup *item;
  pointer pIVar5;
  
  Expression::visitExpression<slang::ast::Expression_const,LookupIdentifier&>
            (this->expr,this->expr,visitor);
  sVar2 = (this->items)._M_extent._M_extent_value;
  if (sVar2 != 0) {
    pIVar5 = (this->items)._M_ptr;
    pIVar1 = pIVar5 + sVar2;
    do {
      sVar2 = (pIVar5->expressions)._M_extent._M_extent_value;
      if (sVar2 != 0) {
        ppEVar3 = (pIVar5->expressions)._M_ptr;
        lVar4 = 0;
        do {
          this_00 = *(Expression **)((long)ppEVar3 + lVar4);
          Expression::visitExpression<slang::ast::Expression_const,LookupIdentifier&>
                    (this_00,this_00,visitor);
          lVar4 = lVar4 + 8;
        } while (sVar2 << 3 != lVar4);
      }
      AssertionExpr::visit<LookupIdentifier>((pIVar5->body).ptr,visitor);
      pIVar5 = pIVar5 + 1;
    } while (pIVar5 != pIVar1);
  }
  if (this->defaultCase != (AssertionExpr *)0x0) {
    AssertionExpr::visit<LookupIdentifier>(this->defaultCase,visitor);
    return;
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        expr.visit(visitor);
        for (auto& item : items) {
            for (auto e : item.expressions)
                e->visit(visitor);
            item.body->visit(visitor);
        }

        if (defaultCase)
            defaultCase->visit(visitor);
    }